

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_unmark_relax(REF_SUBDIV ref_subdiv)

{
  REF_CELL pRVar1;
  uint uVar2;
  REF_CELL *ppRVar3;
  long lVar4;
  REF_INT cell;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  REF_INT nmark;
  REF_BOOL again;
  uint local_3c;
  REF_BOOL local_38;
  undefined4 local_34;
  
  uVar2 = ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
  if (uVar2 == 0) {
    local_38 = 1;
    uVar7 = 0;
    uVar6 = 0;
    do {
      if (local_38 == 0) {
        if (ref_subdiv->instrument == 0) {
          return 0;
        }
        uVar2 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_3c);
        if (uVar2 == 0) {
          if (ref_subdiv->grid->mpi->id != 0) {
            return 0;
          }
          printf(" %d edges marked after %d unmark relaxations\n",(ulong)local_3c,(ulong)uVar6);
          return 0;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               599,"ref_subdiv_unmark_relax",(ulong)uVar2,"count");
        return uVar2;
      }
      local_38 = 0;
      ppRVar3 = ref_subdiv->grid->cell + 8;
      lVar4 = 8;
      local_34 = uVar7;
      do {
        pRVar1 = *ppRVar3;
        if (0 < pRVar1->max) {
          cell = 0;
          do {
            if ((pRVar1->c2n[(long)cell * (long)pRVar1->size_per] != -1) && (pRVar1->node_per == 4))
            {
              ref_subdiv_unmark_tet(ref_subdiv,cell,&local_38);
            }
            cell = cell + 1;
          } while (cell < pRVar1->max);
        }
        ppRVar3 = ref_subdiv->grid->cell + lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      uVar2 = ref_edge_ghost_min_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
      uVar7 = local_34;
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x248,"ref_subdiv_unmark_relax",(ulong)uVar2,"ghost mark");
        return uVar2;
      }
      uVar5 = uVar6 + 1;
      if (4 < uVar6) {
        uVar2 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_3c);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x24b,"ref_subdiv_unmark_relax",(ulong)uVar2,"count");
          return uVar2;
        }
        if (ref_subdiv->grid->mpi->id == 0) {
          printf(" %d edges marked after %d unmark relaxations\n",(ulong)local_3c,(ulong)uVar5);
        }
      }
      if (uVar5 == 200) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x251,"ref_subdiv_unmark_relax","too many sweeps, stop inf loop");
        return 1;
      }
      uVar2 = ref_mpi_all_or(ref_subdiv->grid->mpi,&local_38);
      uVar6 = uVar5;
    } while (uVar2 == 0);
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x253,
           "ref_subdiv_unmark_relax",(ulong)uVar2,"mpi all or");
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x22e,
           "ref_subdiv_unmark_relax",(ulong)uVar2,"ghost mark");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_unmark_relax(REF_SUBDIV ref_subdiv) {
  REF_INT group, cell, nsweeps, nmark;
  REF_CELL ref_cell;
  REF_BOOL again;

  /* make sure consistent before starting */
  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  nsweeps = 0;
  again = REF_TRUE;
  while (again) {
    nsweeps++;
    again = REF_FALSE;

    each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        switch (ref_cell_node_per(ref_cell)) {
          case 4:

            RSS(ref_subdiv_unmark_tet(ref_subdiv, cell, &again), "unmark tet");

            break;
          default:
            /* RSS(REF_IMPLEMENT,"implement cell type"); */
            break;
        }
      }
    }

    /* most conservative, unmark if any ghosts unmarked */
    RSS(ref_edge_ghost_min_int(ref_subdiv_edge(ref_subdiv),
                               ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
        "ghost mark");

    if (nsweeps > 5) {
      RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
      if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
        printf(" %d edges marked after %d unmark relaxations\n", nmark,
               nsweeps);
    }

    RUS(200, nsweeps, "too many sweeps, stop inf loop");

    RSS(ref_mpi_all_or(ref_subdiv_mpi(ref_subdiv), &again), "mpi all or");
  }

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked after %d unmark relaxations\n", nmark, nsweeps);
  }

  return REF_SUCCESS;
}